

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> * __thiscall
CLI::App::get_options(App *this,function<bool_(const_CLI::Option_*)> *filter)

{
  bool bVar1;
  iterator __position;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  __first;
  ulong uVar2;
  string *this_00;
  char *pcVar3;
  App *in_RDX;
  long in_RSI;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_RDI;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> subcopts;
  App *subc;
  shared_ptr<CLI::App> *subcp;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *options;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *in_stack_fffffffffffffe38;
  iterator in_stack_fffffffffffffe40;
  allocator_type *in_stack_fffffffffffffe50;
  anon_class_8_1_552cbcb6_for__M_pred in_stack_fffffffffffffe58;
  const_iterator in_stack_fffffffffffffe60;
  const_iterator in_stack_fffffffffffffe68;
  iterator in_stack_fffffffffffffe80;
  iterator in_stack_fffffffffffffe88;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_d8;
  element_type *local_c0;
  __shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2> *local_b8;
  shared_ptr<CLI::App> *local_b0;
  __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_a8;
  long local_a0;
  Option **local_98;
  Option **local_90;
  Option **local_78;
  Option **local_70;
  Option **local_68;
  Option **local_58;
  Option **local_48;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_40;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_38;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar4;
  
  uVar4 = 0;
  std::
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  ::size((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          *)(in_RSI + 0xd8));
  std::allocator<const_CLI::Option_*>::allocator((allocator<const_CLI::Option_*> *)0x1206d8);
  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
            ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
             in_stack_fffffffffffffe60._M_current,(size_type)in_stack_fffffffffffffe58.filter,
             in_stack_fffffffffffffe50);
  std::allocator<const_CLI::Option_*>::~allocator((allocator<const_CLI::Option_*> *)0x120704);
  local_38 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
             ::std::
             begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                         *)in_stack_fffffffffffffe38);
  local_40 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
             ::std::
             end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                         *)in_stack_fffffffffffffe38);
  __position = ::std::begin<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                         (in_stack_fffffffffffffe38);
  local_48 = __position._M_current;
  __first = ::std::
            transform<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,CLI::App::get_options(std::function<bool(CLI::Option_const*)>)const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                      (local_38,local_40,__position._M_current);
  local_58 = __first._M_current;
  bVar1 = ::std::function::operator_cast_to_bool
                    ((function<bool_(const_CLI::Option_*)> *)in_stack_fffffffffffffe40._M_current);
  if (bVar1) {
    in_stack_fffffffffffffe88 =
         ::std::begin<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                   (in_stack_fffffffffffffe38);
    local_70 = in_stack_fffffffffffffe88._M_current;
    in_stack_fffffffffffffe80 =
         ::std::end<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                   (in_stack_fffffffffffffe38);
    local_78 = in_stack_fffffffffffffe80._M_current;
    local_68 = (Option **)
               ::std::
               remove_if<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,CLI::App::get_options(std::function<bool(CLI::Option_const*)>)const::_lambda(CLI::Option_const*)_1_>
                         (in_stack_fffffffffffffe68._M_current,in_stack_fffffffffffffe60._M_current,
                          in_stack_fffffffffffffe58);
    __gnu_cxx::
    __normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
    ::__normal_iterator<CLI::Option_const**>
              ((__normal_iterator<const_CLI::Option_*const_*,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                *)in_stack_fffffffffffffe40._M_current,
               (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                *)in_stack_fffffffffffffe38);
    local_90 = (Option **)
               ::std::end<std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
                         (in_stack_fffffffffffffe38);
    __gnu_cxx::
    __normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
    ::__normal_iterator<CLI::Option_const**>
              ((__normal_iterator<const_CLI::Option_*const_*,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                *)in_stack_fffffffffffffe40._M_current,
               (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                *)in_stack_fffffffffffffe38);
    local_98 = (Option **)
               std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::erase
                         ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                          in_stack_fffffffffffffe58.filter,in_stack_fffffffffffffe68,
                          in_stack_fffffffffffffe60);
  }
  local_a0 = in_RSI + 0x2c0;
  local_a8._M_current =
       (shared_ptr<CLI::App> *)
       std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                 ((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
                  in_stack_fffffffffffffe38);
  local_b0 = (shared_ptr<CLI::App> *)
             std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             end((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
                 in_stack_fffffffffffffe38);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                             *)in_stack_fffffffffffffe40._M_current,
                            (__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                             *)in_stack_fffffffffffffe38), bVar1) {
    local_b8 = &__gnu_cxx::
                __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                ::operator*(&local_a8)->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
    local_c0 = std::__shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>::get(local_b8);
    get_name_abi_cxx11_(local_c0);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      get_group_abi_cxx11_(local_c0);
      uVar2 = ::std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        this_00 = get_group_abi_cxx11_(local_c0);
        pcVar3 = (char *)::std::__cxx11::string::front();
        if (*pcVar3 == '+') {
          std::function<bool_(const_CLI::Option_*)>::function
                    ((function<bool_(const_CLI::Option_*)> *)this_00,
                     (function<bool_(const_CLI::Option_*)> *)local_c0);
          get_options(in_RDX,(function<bool_(const_CLI::Option_*)> *)
                             CONCAT17(uVar4,in_stack_ffffffffffffffe0));
          std::function<bool_(const_CLI::Option_*)>::~function
                    ((function<bool_(const_CLI::Option_*)> *)0x120a3f);
          std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end
                    (in_stack_fffffffffffffe38);
          __gnu_cxx::
          __normal_iterator<CLI::Option_const*const*,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>
          ::__normal_iterator<CLI::Option_const**>
                    ((__normal_iterator<const_CLI::Option_*const_*,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                      *)in_stack_fffffffffffffe40._M_current,
                     (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                      *)in_stack_fffffffffffffe38);
          in_stack_fffffffffffffe38 = &local_d8;
          std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin
                    (in_stack_fffffffffffffe38);
          std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end
                    (in_stack_fffffffffffffe38);
          in_stack_fffffffffffffe40 =
               ::std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>::
               insert<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,void>
                         (in_stack_fffffffffffffe80._M_current,__position._M_current,__first,
                          in_stack_fffffffffffffe88._M_current);
          std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
                    ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)this_00);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&local_a8);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::vector<const Option *> App::get_options(const std::function<bool(const Option *)> filter) const {
    std::vector<const Option *> options(options_.size());
    std::transform(
        std::begin(options_), std::end(options_), std::begin(options), [](const Option_p &val) { return val.get(); });

    if(filter) {
        options.erase(std::remove_if(std::begin(options),
                                     std::end(options),
                                     [&filter](const Option *opt) { return !filter(opt); }),
                      std::end(options));
    }
    for(const auto &subcp : subcommands_) {
        // also check down into nameless subcommands
        const App *subc = subcp.get();
        if(subc->get_name().empty() && !subc->get_group().empty() && subc->get_group().front() == '+') {
            std::vector<const Option *> subcopts = subc->get_options(filter);
            options.insert(options.end(), subcopts.begin(), subcopts.end());
        }
    }
    return options;
}